

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPDUHandler.cpp
# Opt level: O2

bool handleGetBulkRequestPDU
               (deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
               deque<VarBind,_std::allocator<VarBind>_> *varbindList,
               deque<VarBind,_std::allocator<VarBind>_> *outResponseList,uint nonRepeaters,
               uint maxRepititions)

{
  long lVar1;
  size_type sVar2;
  reference pVVar3;
  ValueCallback *pVVar4;
  ulong uVar5;
  ulong __n;
  int iVar6;
  shared_ptr<BER_CONTAINER> value;
  shared_ptr<BER_CONTAINER> value_1;
  size_t foundAt;
  undefined1 local_40 [16];
  
  if (nonRepeaters == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)nonRepeaters;
    for (__n = 0; (uVar5 != __n &&
                  (sVar2 = Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::size
                                     ((deque<VarBind,_std::allocator<VarBind>_> *)varbindList),
                  __n < sVar2)); __n = __n + 1) {
      pVVar3 = Catch::clara::std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator[]
                         ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)
                          &(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>).
                           _M_impl.super__Deque_impl_data._M_start,__n);
      pVVar4 = ValueCallback::findCallback
                         (callbacks,
                          (pVVar3->oid).super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,true,0,(size_t *)0x0);
      if (pVVar4 == (ValueCallback *)0x0) {
        value_1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x82;
        std::make_shared<ImplicitNullType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)&value);
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<VarBind_const&,std::shared_ptr<ImplicitNullType>>
                  ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,pVVar3,
                   (shared_ptr<ImplicitNullType> *)&value);
      }
      else {
        ValueCallback::getValueForCallback((ValueCallback *)&value,pVVar4);
        if (value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          value_1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 5;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                    ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&pVVar4->OID,
                     (ERROR_STATUS_WITH_VALUE *)&value_1);
        }
        else {
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<VarBind_const&,std::shared_ptr<BER_CONTAINER>&>
                    ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,pVVar3,&value);
        }
      }
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  sVar2 = Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::size
                    ((deque<VarBind,_std::allocator<VarBind>_> *)varbindList);
  if (uVar5 < sVar2) {
    sVar2 = Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::size
                      ((deque<VarBind,_std::allocator<VarBind>_> *)varbindList);
    for (uVar5 = 0; uVar5 != (int)sVar2 - nonRepeaters; uVar5 = uVar5 + 1) {
      pVVar3 = Catch::clara::std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator[]
                         ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)
                          &(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>).
                           _M_impl.super__Deque_impl_data._M_start,
                          (ulong)((int)uVar5 + nonRepeaters));
      Catch::clara::std::__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *)&value,
                 (__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *)pVVar3);
      foundAt = 0;
      iVar6 = maxRepititions + 1;
      do {
        iVar6 = iVar6 + -1;
        if (iVar6 == 0) break;
        pVVar4 = ValueCallback::findCallback
                           (callbacks,
                            (OIDType *)
                            value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,true,foundAt,&foundAt);
        if (pVVar4 == (ValueCallback *)0x0) {
          local_40._0_4_ = 0x82;
          std::make_shared<ImplicitNullType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)&value_1);
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<std::shared_ptr<OIDType>&,std::shared_ptr<ImplicitNullType>>
                    ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,
                     (shared_ptr<OIDType> *)&value,(shared_ptr<ImplicitNullType> *)&value_1);
          Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&value_1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          break;
        }
        ValueCallback::getValueForCallback((ValueCallback *)&value_1,pVVar4);
        lVar1 = CONCAT44(value_1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._4_4_,
                         value_1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._0_4_);
        if (lVar1 == 0) {
          local_40._0_4_ = 5;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                    ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&pVVar4->OID,
                     (ERROR_STATUS_WITH_VALUE *)local_40);
        }
        else {
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,std::shared_ptr<BER_CONTAINER>&>
                    ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&pVVar4->OID,&value_1
                    );
          OIDType::cloneOID((OIDType *)local_40);
          std::__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *)&value,
                     (__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *)local_40);
          Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
        }
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&value_1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      } while (lVar1 != 0);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  return true;
}

Assistant:

bool handleGetBulkRequestPDU(std::deque<ValueCallback*> &callbacks, std::deque<VarBind> &varbindList, std::deque<VarBind> &outResponseList, unsigned int nonRepeaters, unsigned int maxRepititions){
    // from https://tools.ietf.org/html/rfc1448#page-18
    SNMP_LOGD("handleGetBulkRequestPDU, nonRepeaters:%d, maxRepititions:%d, varbindSize:%ld\n", nonRepeaters, maxRepititions, varbindList.size());
    // nonRepeaters is MIN(nonRepeaters, varbindList.size()
    // repeaters is the extra of varbindList.size() - nonRepeaters) which get 'walked' maxRepititions times

    SNMP_LOGD("handling nonRepeaters\n");
    if(nonRepeaters > 0){
        // handle GET normally, but mark endOfMibView if not found
        for(unsigned int i = 0; i < nonRepeaters && i < varbindList.size(); i++){
            const VarBind& requestVarBind = varbindList[i];
            ValueCallback* callback = ValueCallback::findCallback(callbacks, requestVarBind.oid.get(), true);
            if(!callback){
                outResponseList.emplace_back(requestVarBind, std::make_shared<ImplicitNullType>(ENDOFMIBVIEW));
                continue;
            }

            auto value = ValueCallback::getValueForCallback(callback);
            if(!value){
                SNMP_LOGD("Couldn't get value for callback\n");
                outResponseList.emplace_back(callback->OID, GEN_ERR);
                continue;   
            }
            outResponseList.emplace_back(requestVarBind, value);
        }
    }

    if(varbindList.size() > nonRepeaters){
        // For each extra varbind, WALK that tree until maxRepititions or endOfMibView
        SNMP_LOGD("handling repeaters\n");
        unsigned int repeatingVarBinds = varbindList.size() - nonRepeaters;
        
        for(unsigned int i = 0; i < repeatingVarBinds; i++){
            // Store first varbind to get for each line
            auto oid = varbindList[i+nonRepeaters].oid;
            size_t foundAt = 0;

            for(unsigned int j = 0; j < maxRepititions; j++){
                SNMP_LOGD("finding next callback for OID: %s\n", oid->string().c_str());
                ValueCallback* callback = ValueCallback::findCallback(callbacks, oid.get(), true, foundAt, &foundAt);
                if(!callback){
                    // We're done, mark endOfMibView
                    outResponseList.emplace_back(oid, std::make_shared<ImplicitNullType>(ENDOFMIBVIEW));
                    break;
                }

                auto value = ValueCallback::getValueForCallback(callback);

                if(!value){
                    SNMP_LOGD("Couldn't get value for callback\n");
                    outResponseList.emplace_back(callback->OID, GEN_ERR);
                    break;   
                }
                
                outResponseList.emplace_back(callback->OID, value);

                // set next oid to callback OID
                oid = callback->OID->cloneOID();
            }

            //SNMP_LOGD("Walked tree of %s, %d times", (*varbindList)[i+nonRepeaters]->oid->_value, j);
        }
    }

    return true;
}